

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O1

int Saig_MvCreateObj(Saig_MvMan_t *p,int iFan0,int iFan1)

{
  int iVar1;
  size_t sVar2;
  Saig_MvAnd_t *pSVar3;
  uchar *puVar4;
  byte bVar5;
  
  if (p->nObjs == p->nObjsAlloc) {
    sVar2 = (long)p->nObjsAlloc * 0x18;
    if (p->pAigNew == (Saig_MvAnd_t *)0x0) {
      pSVar3 = (Saig_MvAnd_t *)malloc(sVar2);
    }
    else {
      pSVar3 = (Saig_MvAnd_t *)realloc(p->pAigNew,sVar2);
    }
    p->pAigNew = pSVar3;
    sVar2 = (long)p->nObjsAlloc * 2;
    if (p->pLevels == (uchar *)0x0) {
      puVar4 = (uchar *)malloc(sVar2);
    }
    else {
      puVar4 = (uchar *)realloc(p->pLevels,sVar2);
    }
    p->pLevels = puVar4;
    p->nObjsAlloc = p->nObjsAlloc << 1;
  }
  pSVar3 = p->pAigNew;
  iVar1 = p->nObjs;
  pSVar3[iVar1].iFan0 = iFan0;
  pSVar3[iVar1].iFan1 = iFan1;
  pSVar3[iVar1].iNext = 0;
  puVar4 = p->pLevels;
  if (iFan1 == 0 && iFan0 == 0) {
    puVar4[iVar1] = '\0';
    p->nPis = p->nPis + 1;
  }
  else {
    bVar5 = puVar4[iFan1 >> 1];
    if (puVar4[iFan1 >> 1] < puVar4[iFan0 >> 1]) {
      bVar5 = puVar4[iFan0 >> 1];
    }
    puVar4[iVar1] = bVar5 + 1;
  }
  iVar1 = p->nObjs;
  p->nObjs = iVar1 + 1;
  return iVar1;
}

Assistant:

static inline int Saig_MvCreateObj( Saig_MvMan_t * p, int iFan0, int iFan1 )
{
    Saig_MvAnd_t * pNode;
    if ( p->nObjs == p->nObjsAlloc )
    {
        p->pAigNew = ABC_REALLOC( Saig_MvAnd_t, p->pAigNew, 2*p->nObjsAlloc );
        p->pLevels = ABC_REALLOC( unsigned char, p->pLevels, 2*p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pNode = p->pAigNew + p->nObjs;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
    pNode->iNext = 0;
    if ( iFan0 || iFan1 )
        p->pLevels[p->nObjs] = 1 + Abc_MaxInt( Saig_MvLev(p, iFan0), Saig_MvLev(p, iFan1) );
    else
        p->pLevels[p->nObjs] = 0, p->nPis++;
    return p->nObjs++;
}